

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# act_wiz.c
# Opt level: O1

void do_smote(CHAR_DATA *ch,char *argument)

{
  char cVar1;
  uint uVar2;
  bool bVar3;
  char *pcVar4;
  char *__s;
  size_t sVar5;
  size_t sVar6;
  size_t sVar7;
  CHAR_DATA *ch_00;
  char temp [4608];
  char last [4608];
  char local_2438 [4608];
  char local_1238 [4616];
  
  bVar3 = is_npc(ch);
  if ((bVar3) || ((ch->comm[0] & 0x80000) == 0)) {
    if (*argument == '\0') {
      pcVar4 = "Emote what?\n\r";
    }
    else {
      pcVar4 = strstr(argument,ch->name);
      if ((pcVar4 != (char *)0x0) || (bVar3 = is_npc(ch), bVar3)) {
        send_to_char(argument,ch);
        send_to_char("\n\r",ch);
        ch_00 = ch->in_room->people;
        if (ch_00 == (CHAR_DATA *)0x0) {
          return;
        }
        sVar7 = 0;
LAB_0026b237:
        if ((ch_00 != ch) && (ch_00->desc != (DESCRIPTOR_DATA *)0x0)) {
          __s = strstr(argument,ch_00->name);
          pcVar4 = argument;
          if (__s != (char *)0x0) {
            strcpy(local_2438,argument);
            sVar5 = strlen(argument);
            sVar6 = strlen(__s);
            local_2438[sVar5 - sVar6] = '\0';
            local_1238[0] = '\0';
            pcVar4 = ch_00->name;
            do {
              cVar1 = *__s;
              if (cVar1 == '\'') {
                sVar5 = strlen(ch_00->name);
                if (sVar5 != sVar7) goto LAB_0026b2fc;
                sVar5 = strlen(local_2438);
                (local_2438 + sVar5)[0] = 'r';
                (local_2438 + sVar5)[1] = '\0';
              }
              else {
                if (cVar1 == 's') {
                  sVar5 = strlen(ch_00->name);
                  if (sVar5 != sVar7) goto LAB_0026b2fc;
                }
                else {
                  if (cVar1 == '\0') goto LAB_0026b3a0;
LAB_0026b2fc:
                  if (cVar1 == *pcVar4) {
                    sVar5 = strlen(ch_00->name);
                    uVar2 = (int)sVar7 + 1;
                    if (sVar5 == sVar7) {
                      uVar2 = 1;
                    }
                    sVar7 = (size_t)uVar2;
                    if (sVar5 == sVar7) {
                      sVar5 = strlen(local_2438);
                      builtin_strncpy(local_2438 + sVar5,"you",4);
                      local_1238[0] = '\0';
                      pcVar4 = ch_00->name;
                    }
                    else {
                      pcVar4 = pcVar4 + 1;
                      strncat(local_1238,__s,1);
                    }
                    goto LAB_0026b398;
                  }
                  strcat(local_2438,local_1238);
                  strncat(local_2438,__s,1);
                  local_1238[0] = '\0';
                  pcVar4 = ch_00->name;
                }
                sVar7 = 0;
              }
LAB_0026b398:
              __s = __s + 1;
            } while( true );
          }
          goto LAB_0026b3b3;
        }
        goto LAB_0026b3ca;
      }
      pcVar4 = "You must include your name in an smote.\n\r";
    }
  }
  else {
    pcVar4 = "You can\'t show your emotions.\n\r";
  }
  send_to_char(pcVar4,ch);
  return;
LAB_0026b3a0:
  pcVar4 = local_2438;
LAB_0026b3b3:
  send_to_char(pcVar4,ch_00);
  send_to_char("\n\r",ch_00);
LAB_0026b3ca:
  ch_00 = ch_00->next_in_room;
  if (ch_00 == (CHAR_DATA *)0x0) {
    return;
  }
  goto LAB_0026b237;
}

Assistant:

void do_smote(CHAR_DATA *ch, char *argument)
{
	CHAR_DATA *vch;
	char *letter, *name;
	char last[MAX_INPUT_LENGTH], temp[MAX_STRING_LENGTH];
	unsigned int matches = 0;

	if (!is_npc(ch) && IS_SET(ch->comm, COMM_NOEMOTE))
	{
		send_to_char("You can't show your emotions.\n\r", ch);
		return;
	}

	if (argument[0] == '\0')
	{
		send_to_char("Emote what?\n\r", ch);
		return;
	}

	if (strstr(argument, ch->name) == nullptr && !is_npc(ch))
	{
		send_to_char("You must include your name in an smote.\n\r", ch);
		return;
	}

	send_to_char(argument, ch);
	send_to_char("\n\r", ch);

	for (vch = ch->in_room->people; vch != nullptr; vch = vch->next_in_room)
	{
		if (vch->desc == nullptr || vch == ch)
			continue;

		letter = strstr(argument, vch->name);

		if (letter == nullptr)
		{
			send_to_char(argument, vch);
			send_to_char("\n\r", vch);
			continue;
		}

		strcpy(temp, argument);
		temp[strlen(argument) - strlen(letter)] = '\0';
		last[0] = '\0';
		name = vch->name;

		for (; *letter != '\0'; letter++)
		{
			if (*letter == '\'' && matches == strlen(vch->name))
			{
				strcat(temp, "r");
				continue;
			}

			if (*letter == 's' && matches == strlen(vch->name))
			{
				matches = 0;
				continue;
			}

			if (matches == strlen(vch->name))
			{
				matches = 0;
			}

			if (*letter == *name)
			{
				matches++;
				name++;

				if (matches == strlen(vch->name))
				{
					strcat(temp, "you");
					last[0] = '\0';
					name = vch->name;
					continue;
				}

				strncat(last, letter, 1);
				continue;
			}

			matches = 0;
			strcat(temp, last);
			strncat(temp, letter, 1);
			last[0] = '\0';
			name = vch->name;
		}

		send_to_char(temp, vch);
		send_to_char("\n\r", vch);
	}
}